

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_addsessionid(connectdata *conn,void *ssl_sessionid,size_t idsize)

{
  Curl_easy *pCVar1;
  Curl_share *pCVar2;
  ulong uVar3;
  curl_ssl_session *pcVar4;
  long lVar5;
  _Bool _Var6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  curl_ssl_session *session;
  long lVar11;
  long lVar12;
  long *plVar13;
  char *local_48;
  
  pCVar1 = conn->data;
  session = (pCVar1->state).session;
  lVar11 = session->age;
  pcVar8 = (*Curl_cstrdup)((conn->host).name);
  if (pcVar8 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((conn->bits).conn_to_host == true) {
    local_48 = (*Curl_cstrdup)((conn->conn_to_host).name);
    if (local_48 == (char *)0x0) {
      (*Curl_cfree)(pcVar8);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    local_48 = (char *)0x0;
  }
  if ((conn->bits).conn_to_port == true) {
    iVar7 = conn->conn_to_port;
  }
  else {
    iVar7 = -1;
  }
  pCVar2 = pCVar1->share;
  if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x10) == 0)) {
    plVar13 = &(pCVar1->state).sessionage;
  }
  else {
    plVar13 = &pCVar2->sessionage;
  }
  uVar3 = (pCVar1->set).ssl.max_ssl_sessions;
  uVar10 = 1;
  for (lVar12 = 0xa8;
      (uVar9 = uVar3 + (uVar3 == 0), uVar10 < uVar3 &&
      (pcVar4 = (pCVar1->state).session, uVar9 = uVar10,
      *(long *)((long)&pcVar4->sessionid + lVar12) != 0)); lVar12 = lVar12 + 0xa8) {
    lVar5 = *(long *)((long)&pcVar4->age + lVar12);
    if (lVar5 < lVar11) {
      lVar11 = lVar5;
      session = (curl_ssl_session *)((long)&pcVar4->name + lVar12);
    }
    uVar10 = uVar10 + 1;
  }
  if (uVar9 == uVar3) {
    Curl_ssl_kill_session(session);
  }
  else {
    session = (pCVar1->state).session + uVar9;
  }
  session->sessionid = ssl_sessionid;
  session->idsize = idsize;
  session->age = *plVar13;
  (*Curl_cfree)(session->name);
  (*Curl_cfree)(session->conn_to_host);
  session->name = pcVar8;
  session->conn_to_host = local_48;
  session->conn_to_port = iVar7;
  session->remote_port = conn->remote_port;
  _Var6 = Curl_clone_ssl_config(&conn->ssl_config,&session->ssl_config);
  if (!_Var6) {
    session->sessionid = (void *)0x0;
    (*Curl_cfree)(pcVar8);
    (*Curl_cfree)(local_48);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct connectdata *conn,
                               void *ssl_sessionid,
                               size_t idsize)
{
  size_t i;
  struct Curl_easy *data=conn->data; /* the mother of all structs */
  struct curl_ssl_session *store = &data->state.session[0];
  long oldest_age=data->state.session[0].age; /* zero if unused */
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;

  DEBUGASSERT(conn->ssl_config.sessionid);

  clone_host = strdup(conn->host.name);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
    /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  store->remote_port = conn->remote_port; /* port number */

  if(!Curl_clone_ssl_config(&conn->ssl_config, &store->ssl_config)) {
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}